

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_crld.cc
# Opt level: O1

int i2r_idp(X509V3_EXT_METHOD *method,void *pidp,BIO *out,int indent)

{
  if (*pidp != (DIST_POINT_NAME *)0x0) {
    print_distpoint(out,*pidp,indent);
  }
  if (0 < *(int *)((long)pidp + 8)) {
    BIO_printf((BIO *)out,"%*sOnly User Certificates\n",(ulong)(uint)indent,"");
  }
  if (0 < *(int *)((long)pidp + 0xc)) {
    BIO_printf((BIO *)out,"%*sOnly CA Certificates\n",(ulong)(uint)indent,"");
  }
  if (0 < *(int *)((long)pidp + 0x18)) {
    BIO_printf((BIO *)out,"%*sIndirect CRL\n",(ulong)(uint)indent,"");
  }
  if (*(ASN1_BIT_STRING **)((long)pidp + 0x10) != (ASN1_BIT_STRING *)0x0) {
    print_reasons(out,"Only Some Reasons",*(ASN1_BIT_STRING **)((long)pidp + 0x10),indent);
  }
  if (0 < *(int *)((long)pidp + 0x1c)) {
    BIO_printf((BIO *)out,"%*sOnly Attribute Certificates\n",(ulong)(uint)indent,"");
  }
  if ((((*pidp == 0) && (*(int *)((long)pidp + 8) < 1)) && (*(int *)((long)pidp + 0xc) < 1)) &&
     (((*(int *)((long)pidp + 0x18) < 1 && (*(long *)((long)pidp + 0x10) == 0)) &&
      (*(int *)((long)pidp + 0x1c) < 1)))) {
    BIO_printf((BIO *)out,"%*s<EMPTY>\n",(ulong)(uint)indent,"");
  }
  return 1;
}

Assistant:

static int i2r_idp(const X509V3_EXT_METHOD *method, void *pidp, BIO *out,
                   int indent) {
  ISSUING_DIST_POINT *idp = reinterpret_cast<ISSUING_DIST_POINT *>(pidp);
  if (idp->distpoint) {
    print_distpoint(out, idp->distpoint, indent);
  }
  if (idp->onlyuser > 0) {
    BIO_printf(out, "%*sOnly User Certificates\n", indent, "");
  }
  if (idp->onlyCA > 0) {
    BIO_printf(out, "%*sOnly CA Certificates\n", indent, "");
  }
  if (idp->indirectCRL > 0) {
    BIO_printf(out, "%*sIndirect CRL\n", indent, "");
  }
  if (idp->onlysomereasons) {
    print_reasons(out, "Only Some Reasons", idp->onlysomereasons, indent);
  }
  if (idp->onlyattr > 0) {
    BIO_printf(out, "%*sOnly Attribute Certificates\n", indent, "");
  }
  if (!idp->distpoint && (idp->onlyuser <= 0) && (idp->onlyCA <= 0) &&
      (idp->indirectCRL <= 0) && !idp->onlysomereasons &&
      (idp->onlyattr <= 0)) {
    BIO_printf(out, "%*s<EMPTY>\n", indent, "");
  }

  return 1;
}